

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int bb_spi_open(int pi,uint CS,uint MISO,uint MOSI,uint SCLK,uint baud,uint spiFlags)

{
  int iVar1;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  uint8_t buf [20];
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined1 local_38 [8];
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                             in_stack_ffffffffffffffb8,(int)((ulong)local_38 >> 0x20),(int)local_38,
                             0,(gpioExtent_t *)CONCAT44(in_R9D,in_R8D),in_stack_00000008);
  return iVar1;
}

Assistant:

int bb_spi_open(
   int pi,
   unsigned CS, unsigned MISO, unsigned MOSI, unsigned SCLK,
   unsigned baud, unsigned spiFlags)
{
   uint8_t buf[20];
   gpioExtent_t ext[1];

   /*
   p1=CS
   p2=0
   p3=20
   ## extension ##
   uint32_t MISO
   uint32_t MOSI
   uint32_t SCLK
   uint32_t baud
   uint32_t spiFlags
   */

   ext[0].size = 20;
   ext[0].ptr = &buf;

   memcpy(buf +  0, &MISO, 4);
   memcpy(buf +  4, &MOSI, 4);
   memcpy(buf +  8, &SCLK, 4);
   memcpy(buf + 12, &baud, 4);
   memcpy(buf + 16, &spiFlags, 4);

   return pigpio_command_ext
      (pi, PI_CMD_BSPIO, CS, 0, 20, 1, ext, 1);
}